

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTestShared.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::NegativeTestShared::NegativeTestContext::beginSection
          (NegativeTestContext *this,string *desc)

{
  TestLog *pTVar1;
  size_t in_RCX;
  void *__buf;
  allocator<char> local_81;
  string local_80;
  LogSection local_60;
  
  if ((this->super_CallLogWrapper).m_enableLog == true) {
    pTVar1 = (this->super_CallLogWrapper).m_log;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"callstream",&local_81);
    tcu::LogSection::LogSection(&local_60,&local_80,desc);
    tcu::LogSection::write(&local_60,(int)pTVar1,__buf,in_RCX);
    tcu::LogSection::~LogSection(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    this->m_openSections = this->m_openSections + 1;
  }
  return;
}

Assistant:

void NegativeTestContext::beginSection (const string& desc)
{
	if (isLoggingEnabled())
	{
		getLog() << TestLog::Section("callstream", desc);
		m_openSections++;
	}
}